

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_loadScript(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  char *pcVar2;
  uint8_t *puVar3;
  JSContext *in_RDI;
  JSValue JVar4;
  size_t buf_len;
  JSValue ret;
  char *filename;
  uint8_t *buf;
  void *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  JSContext *ctx_00;
  undefined1 in_stack_ffffffffffffff90 [16];
  JSContext *in_stack_ffffffffffffffa0;
  JSContext *in_stack_ffffffffffffffa8;
  JSValueUnion ctx_01;
  int32_t local_10;
  undefined4 uStack_c;
  char *local_8;
  
  JVar4.tag._0_4_ = in_stack_ffffffffffffff80;
  JVar4.u.ptr = in_stack_ffffffffffffff78;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff84;
  pcVar2 = JS_ToCString((JSContext *)0x10dc65,JVar4);
  if (pcVar2 == (char *)0x0) {
    local_10 = 0;
    local_8 = (char *)0x6;
  }
  else {
    puVar3 = js_load_file(in_stack_ffffffffffffffa8,(size_t *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff90._8_8_);
    ctx_00 = in_stack_ffffffffffffff90._0_8_;
    if (puVar3 == (uint8_t *)0x0) {
      JVar4 = JS_ThrowReferenceError(in_RDI,"could not load \'%s\'",pcVar2);
      JS_FreeCString((JSContext *)JVar4.u.ptr,in_stack_ffffffffffffff88);
      local_10 = 0;
      local_8 = (char *)0x6;
    }
    else {
      JVar4 = JS_Eval(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90._8_8_,(size_t)ctx_00,
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      local_8 = (char *)JVar4.tag;
      ctx_01 = JVar4.u;
      pcVar2 = local_8;
      js_free((JSContext *)ctx_01.ptr,in_stack_ffffffffffffff78);
      JS_FreeCString(ctx_00,pcVar2);
      local_10 = ctx_01.int32;
      uStack_c = ctx_01._4_4_;
    }
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_loadScript(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    uint8_t *buf;
    const char *filename;
    JSValue ret;
    size_t buf_len;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
    buf = js_load_file(ctx, &buf_len, filename);
    if (!buf) {
        JS_ThrowReferenceError(ctx, "could not load '%s'", filename);
        JS_FreeCString(ctx, filename);
        return JS_EXCEPTION;
    }
    ret = JS_Eval(ctx, (char *)buf, buf_len, filename,
                  JS_EVAL_TYPE_GLOBAL);
    js_free(ctx, buf);
    JS_FreeCString(ctx, filename);
    return ret;
}